

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O3

bool __thiscall
vending::vending_def::on::serving::enough_money::operator()
          (enough_money *this,
          inner_state_machine<vending::vending_def::on::serving,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>
          *fsm,active *state,select_item *item)

{
  enclosing_fsm_type *peVar1;
  ulong uVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  float fVar6;
  
  peVar1 = fsm->fsm_->fsm_;
  p_Var5 = *(_Base_ptr *)
            ((long)&(peVar1->
                    super_state_machine_base<vending::vending_def,_afsm::none,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                    ).super_type.super_state_base<vending::vending_def>.super_type.super_vending_def
                    .goods._M_t + 0x10);
  fVar6 = 0.0;
  if (p_Var5 != (_Base_ptr)0x0) {
    uVar2 = item->p_no;
    p_Var3 = (_Base_ptr)
             ((long)&(peVar1->
                     super_state_machine_base<vending::vending_def,_afsm::none,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                     ).super_type.super_state_base<vending::vending_def>.super_type.
                     super_vending_def.goods._M_t + 8);
    p_Var4 = p_Var3;
    do {
      if (*(ulong *)(p_Var5 + 1) >= uVar2) {
        p_Var4 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[*(ulong *)(p_Var5 + 1) < uVar2];
    } while (p_Var5 != (_Base_ptr)0x0);
    if ((p_Var4 != p_Var3) && (*(ulong *)(p_Var4 + 1) <= uVar2)) {
      fVar6 = *(float *)((long)&p_Var4[1]._M_parent + 4);
    }
  }
  return fVar6 <= state->balance;
}

Assistant:

enclosing_fsm_type const&
    enclosing_fsm() const
    { return *fsm_; }